

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
CP::vector<std::pair<int,_int>_>::vector
          (vector<std::pair<int,_int>_> *this,vector<std::pair<int,_int>_> *a)

{
  ulong uVar1;
  size_t sVar2;
  pair<int,_int> *ppVar3;
  pair<int,_int> *__s;
  long lVar4;
  size_t sVar5;
  
  uVar1 = a->mCap;
  __s = (pair<int,_int> *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
  if (uVar1 != 0) {
    memset(__s,0,uVar1 * 8);
  }
  this->mData = __s;
  this->mCap = uVar1;
  sVar2 = a->mSize;
  this->mSize = sVar2;
  ppVar3 = a->mData;
  lVar4 = 0;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    __s[sVar5] = *(pair<int,_int> *)((long)&ppVar3->first + (lVar4 >> 0x1d));
    lVar4 = lVar4 + 0x100000000;
  }
  return;
}

Assistant:

vector(const vector<T>& a) {
      mData = new T[a.capacity()]();
      mCap = a.capacity();
      mSize = a.size();
      for (size_t i = 0;i < a.size();i++) {
        mData[i] = a[i];
      }
    }